

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O0

int iterPolyReset(mpt_iterator *it)

{
  mpt_buffer *buf;
  mpt_iteratorPolynom *d;
  mpt_iterator *it_local;
  
  it[5]._vptr = (_mpt_vptr_iterator *)0x0;
  if (it[4]._vptr == (_mpt_vptr_iterator *)0x0) {
    it_local._4_4_ = 0;
  }
  else {
    it_local._4_4_ = (int)((ulong)it[4]._vptr[1].value >> 3);
  }
  return it_local._4_4_;
}

Assistant:

static int iterPolyReset(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorPolynom) *d = MPT_baseaddr(iteratorPolynom, it, _it);
	MPT_STRUCT(buffer) *buf;
	d->pos = 0;
	if ((buf = d->grid._buf)) {
		return buf->_used / sizeof(double);
	}
	return 0;
}